

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

string * readJson_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_31;
  string filename;
  
  std::__cxx11::string::string
            ((string *)&filename,
             "/workspace/llm4binary/github/license_all_cmakelists_25/peakchen90[P]json-parser-cpp/src/test.cpp"
             ,&local_31);
  std::__cxx11::string::replace((ulong)&filename,filename._M_string_length - 8,(char *)0x8);
  JSON::readFile(in_RDI,&filename);
  std::__cxx11::string::~string((string *)&filename);
  return in_RDI;
}

Assistant:

string readJson() {
    string filename = __FILE__;
    filename.replace(filename.length() - 8, 8, "test.json");
    return JSON::readFile(filename);
}